

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O2

void __thiscall
mjs::gc_vector<const_mjs::function_definition_*>::erase
          (gc_vector<const_mjs::function_definition_*> *this,function_definition **elem)

{
  gc_table *pgVar1;
  function_definition **ppfVar2;
  
  pgVar1 = tab(this);
  if (pgVar1 + 1 <= elem) {
    ppfVar2 = end(this);
    if (elem < ppfVar2) {
      pgVar1 = tab(this);
      erase(this,(uint32_t)((ulong)((long)elem + (-0x10 - (long)pgVar1)) >> 3));
      return;
    }
  }
  __assert_fail("elem >= begin() && elem < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x3a,
                "void mjs::gc_vector<const mjs::function_definition *>::erase(T *) [T = const mjs::function_definition *]"
               );
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }